

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ScalarEvolutionAnalysis::ScalarEvolutionAnalysis
          (ScalarEvolutionAnalysis *this,IRContext *context)

{
  SECantCompute *this_00;
  SENode *pSVar1;
  unique_ptr<spvtools::opt::SECantCompute,_std::default_delete<spvtools::opt::SECantCompute>_>
  local_28;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_20;
  IRContext *local_18;
  IRContext *context_local;
  ScalarEvolutionAnalysis *this_local;
  
  this->context_ = context;
  local_18 = context;
  context_local = (IRContext *)this;
  std::
  map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
  ::map(&this->recurrent_node_map_);
  std::
  unordered_set<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_spvtools::opt::SENodeHash,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>_>
  ::unordered_set(&this->node_cache_);
  memset(&this->pretend_equal_,0,0x30);
  std::
  map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
  ::map(&this->pretend_equal_);
  this_00 = (SECantCompute *)::operator_new(0x30);
  SECantCompute::SECantCompute(this_00,this);
  std::unique_ptr<spvtools::opt::SECantCompute,std::default_delete<spvtools::opt::SECantCompute>>::
  unique_ptr<std::default_delete<spvtools::opt::SECantCompute>,void>
            ((unique_ptr<spvtools::opt::SECantCompute,std::default_delete<spvtools::opt::SECantCompute>>
              *)&local_28,this_00);
  std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
  unique_ptr<spvtools::opt::SECantCompute,std::default_delete<spvtools::opt::SECantCompute>,void>
            ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
             &local_20,&local_28);
  pSVar1 = GetCachedOrAdd(this,&local_20);
  this->cached_cant_compute_ = pSVar1;
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<spvtools::opt::SECantCompute,_std::default_delete<spvtools::opt::SECantCompute>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

ScalarEvolutionAnalysis::ScalarEvolutionAnalysis(IRContext* context)
    : context_(context), pretend_equal_{} {
  // Create and cached the CantComputeNode.
  cached_cant_compute_ =
      GetCachedOrAdd(std::unique_ptr<SECantCompute>(new SECantCompute(this)));
}